

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_key.cpp
# Opt level: O2

PubkeyDataStruct *
cfd::js::api::KeyStructApi::TweakAddPubkey
          (PubkeyDataStruct *__return_storage_ptr__,TweakPubkeyDataStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::TweakPubkeyDataStruct_&)> local_f8;
  PubkeyDataStruct local_d8;
  
  PubkeyDataStruct::PubkeyDataStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::TweakPubkeyDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_key.cpp:274:7)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::TweakPubkeyDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_key.cpp:274:7)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"TweakAddPubkey",&local_119);
  ExecuteStructApi<cfd::js::api::TweakPubkeyDataStruct,cfd::js::api::PubkeyDataStruct>
            (&local_d8,(api *)request,(TweakPubkeyDataStruct *)&local_118,&local_f8,in_R8);
  PubkeyDataStruct::operator=(__return_storage_ptr__,&local_d8);
  PubkeyDataStruct::~PubkeyDataStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

PubkeyDataStruct KeyStructApi::TweakAddPubkey(
    const TweakPubkeyDataStruct& request) {
  auto call_func =
      [](const TweakPubkeyDataStruct& request) -> PubkeyDataStruct {
    PubkeyDataStruct response;
    Pubkey pubkey(request.pubkey);
    ByteData256 tweak(request.tweak);
    response.pubkey = pubkey.CreateTweakAdd(tweak).GetHex();
    return response;
  };

  PubkeyDataStruct result;
  result = ExecuteStructApi<TweakPubkeyDataStruct, PubkeyDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}